

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cxx::MessageGenerator::GenerateSerializeWithCachedSizesBody
          (MessageGenerator *this,Printer *printer,bool to_array)

{
  int iVar1;
  int iVar2;
  FieldDescriptor **ppFVar3;
  iterator iVar4;
  iterator iVar5;
  size_type sVar6;
  reference ppEVar7;
  FileDescriptor *file;
  long lVar8;
  bool bVar9;
  int local_7c;
  int local_78;
  int j;
  int i;
  ExtensionRange *local_60 [3];
  int local_44;
  undefined1 local_40 [4];
  int i_1;
  vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
  sorted_extensions;
  scoped_array<const_google::protobuf::FieldDescriptor_*> ordered_fields;
  bool to_array_local;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  ppFVar3 = anon_unknown_0::SortFieldsByNumber(this->descriptor_);
  internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::scoped_array
            ((scoped_array<const_google::protobuf::FieldDescriptor_*> *)
             &sorted_extensions.
              super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,ppFVar3);
  std::
  vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
  ::vector((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
            *)local_40);
  for (local_44 = 0; iVar2 = local_44, iVar1 = Descriptor::extension_range_count(this->descriptor_),
      iVar2 < iVar1; local_44 = local_44 + 1) {
    local_60[0] = Descriptor::extension_range(this->descriptor_,local_44);
    std::
    vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
    ::push_back((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                 *)local_40,local_60);
  }
  iVar4 = std::
          vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
          ::begin((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                   *)local_40);
  iVar5 = std::
          vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
          ::end((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                 *)local_40);
  std::
  sort<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor::ExtensionRange_const**,std::vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>>,google::protobuf::compiler::cxx::(anonymous_namespace)::ExtensionRangeSorter>
            (iVar4._M_current,iVar5._M_current);
  local_78 = 0;
  local_7c = 0;
  while( true ) {
    iVar2 = Descriptor::field_count(this->descriptor_);
    bVar9 = true;
    if (iVar2 <= local_78) {
      sVar6 = std::
              vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
              ::size((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                      *)local_40);
      bVar9 = (ulong)(long)local_7c < sVar6;
    }
    if (!bVar9) break;
    iVar2 = Descriptor::field_count(this->descriptor_);
    if (local_78 == iVar2) {
      sVar6 = (size_type)local_7c;
      local_7c = local_7c + 1;
      ppEVar7 = std::
                vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                ::operator[]((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                              *)local_40,sVar6);
      GenerateSerializeOneExtensionRange(this,printer,*ppEVar7,to_array);
    }
    else {
      sVar6 = std::
              vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
              ::size((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                      *)local_40);
      if ((long)local_7c == sVar6) {
        lVar8 = (long)local_78;
        local_78 = local_78 + 1;
        ppFVar3 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                            ((scoped_array<const_google::protobuf::FieldDescriptor_*> *)
                             &sorted_extensions.
                              super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,lVar8);
        GenerateSerializeOneField(this,printer,*ppFVar3,to_array);
      }
      else {
        ppFVar3 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                            ((scoped_array<const_google::protobuf::FieldDescriptor_*> *)
                             &sorted_extensions.
                              super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_78);
        iVar2 = FieldDescriptor::number(*ppFVar3);
        ppEVar7 = std::
                  vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                  ::operator[]((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                                *)local_40,(long)local_7c);
        if (iVar2 < (*ppEVar7)->start) {
          lVar8 = (long)local_78;
          local_78 = local_78 + 1;
          ppFVar3 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                              ((scoped_array<const_google::protobuf::FieldDescriptor_*> *)
                               &sorted_extensions.
                                super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,lVar8);
          GenerateSerializeOneField(this,printer,*ppFVar3,to_array);
        }
        else {
          sVar6 = (size_type)local_7c;
          local_7c = local_7c + 1;
          ppEVar7 = std::
                    vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                    ::operator[]((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                                  *)local_40,sVar6);
          GenerateSerializeOneExtensionRange(this,printer,*ppEVar7,to_array);
        }
      }
    }
  }
  file = Descriptor::file(this->descriptor_);
  bVar9 = HasUnknownFields(file);
  if (bVar9) {
    io::Printer::Print(printer,"if (!unknown_fields().empty()) {\n");
    io::Printer::Indent(printer);
    if (to_array) {
      io::Printer::Print(printer,
                         "target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(\n    unknown_fields(), target);\n"
                        );
    }
    else {
      io::Printer::Print(printer,
                         "::google::protobuf::internal::WireFormat::SerializeUnknownFields(\n    unknown_fields(), output);\n"
                        );
    }
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"}\n");
  }
  std::
  vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
  ::~vector((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
             *)local_40);
  internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::~scoped_array
            ((scoped_array<const_google::protobuf::FieldDescriptor_*> *)
             &sorted_extensions.
              super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void MessageGenerator::
GenerateSerializeWithCachedSizesBody(io::Printer* printer, bool to_array) {
  scoped_array<const FieldDescriptor*> ordered_fields(
    SortFieldsByNumber(descriptor_));

  vector<const Descriptor::ExtensionRange*> sorted_extensions;
  for (int i = 0; i < descriptor_->extension_range_count(); ++i) {
    sorted_extensions.push_back(descriptor_->extension_range(i));
  }
  sort(sorted_extensions.begin(), sorted_extensions.end(),
       ExtensionRangeSorter());

  // Merge the fields and the extension ranges, both sorted by field number.
  int i, j;
  for (i = 0, j = 0;
       i < descriptor_->field_count() || j < sorted_extensions.size();
       ) {
    if (i == descriptor_->field_count()) {
      GenerateSerializeOneExtensionRange(printer,
                                         sorted_extensions[j++],
                                         to_array);
    } else if (j == sorted_extensions.size()) {
      GenerateSerializeOneField(printer, ordered_fields[i++], to_array);
    } else if (ordered_fields[i]->number() < sorted_extensions[j]->start) {
      GenerateSerializeOneField(printer, ordered_fields[i++], to_array);
    } else {
      GenerateSerializeOneExtensionRange(printer,
                                         sorted_extensions[j++],
                                         to_array);
    }
  }

  if (HasUnknownFields(descriptor_->file())) {
    printer->Print("if (!unknown_fields().empty()) {\n");
    printer->Indent();
    if (to_array) {
      printer->Print(
        "target = "
            "::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(\n"
        "    unknown_fields(), target);\n");
    } else {
      printer->Print(
        "::google::protobuf::internal::WireFormat::SerializeUnknownFields(\n"
        "    unknown_fields(), output);\n");
    }
    printer->Outdent();

    printer->Print(
      "}\n");
  }
}